

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_to_core.cpp
# Opt level: O0

Literal * skiwi::anon_unknown_26::_make_false(void)

{
  variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
  *in_RDI;
  undefined1 local_58 [8];
  False fa;
  Literal *lit;
  
  fa.filename.field_2._M_local_buf[0xf] = '\0';
  std::
  variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  ::variant((variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             *)in_RDI);
  False::False((False *)local_58);
  local_58._0_4_ = -1;
  local_58._4_4_ = -1;
  std::
  variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
  ::operator=(in_RDI,(False *)local_58);
  fa.filename.field_2._M_local_buf[0xf] = '\x01';
  False::~False((False *)local_58);
  if ((fa.filename.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~variant((variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                *)in_RDI);
  }
  return (Literal *)in_RDI;
}

Assistant:

Literal _make_false()
    {
    Literal lit;
    False fa;
    fa.line_nr = -1;
    fa.column_nr = -1;
    lit = fa;
    return lit;
    }